

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_buffer_stream.h
# Opt level: O0

bool __thiscall crnlib::buffer_stream::seek(buffer_stream *this,int64 ofs,bool relative)

{
  uint uVar1;
  bool bVar2;
  byte in_DL;
  long in_RSI;
  data_stream *in_RDI;
  int64 new_ofs;
  long local_38;
  bool local_1;
  
  if (((in_RDI->field_0x1a & 1) == 0) ||
     (bVar2 = data_stream::is_seekable((data_stream *)0x1314c3), !bVar2)) {
    local_1 = false;
  }
  else {
    local_38 = in_RSI;
    if ((in_DL & 1) != 0) {
      local_38 = (ulong)*(uint *)&in_RDI[1].m_name.field_0x4 + in_RSI;
    }
    if (local_38 < 0) {
      local_1 = false;
    }
    else {
      uVar1._0_2_ = in_RDI[1].m_name.m_buf_size;
      uVar1._2_2_ = in_RDI[1].m_name.m_len;
      if ((long)(ulong)uVar1 < local_38) {
        local_1 = false;
      }
      else {
        *(int *)&in_RDI[1].m_name.field_0x4 = (int)local_38;
        data_stream::post_seek(in_RDI);
        local_1 = true;
      }
    }
  }
  return local_1;
}

Assistant:

virtual bool seek(int64 ofs, bool relative) {
    if ((!m_opened) || (!is_seekable()))
      return false;

    int64 new_ofs = relative ? (m_ofs + ofs) : ofs;

    if (new_ofs < 0)
      return false;
    else if (new_ofs > m_size)
      return false;

    m_ofs = static_cast<uint>(new_ofs);

    post_seek();

    return true;
  }